

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZShapeHDiv.cpp
# Opt level: O2

void TPZShapeHDiv<pzshape::TPZShapeTetra>::Initialize
               (TPZVec<long> *ids,TPZVec<int> *connectorders,TPZVec<int> *sideorient,
               TPZShapeData *data)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  int i;
  long lVar6;
  int scalarorder;
  TPZManVector<int,_27> scalarOrders;
  TPZManVector<int,_27> local_c0;
  
  TPZManVector<long,_8>::TPZManVector((TPZManVector<long,_8> *)&scalarOrders,ids);
  TPZManVector<long,_8>::operator=(&data->fCornerNodeIds,(TPZManVector<long,_8> *)&scalarOrders);
  TPZManVector<long,_8>::~TPZManVector((TPZManVector<long,_8> *)&scalarOrders);
  TPZManVector<int,_20>::TPZManVector((TPZManVector<int,_20> *)&scalarOrders,sideorient);
  TPZManVector<int,_20>::operator=(&data->fSideOrient,(TPZManVector<int,_20> *)&scalarOrders);
  TPZManVector<int,_20>::~TPZManVector((TPZManVector<int,_20> *)&scalarOrders);
  scalarorder = connectorders->fStore[4] + 1;
  TPZManVector<int,_27>::TPZManVector(&scalarOrders,0xb,&scalarorder);
  TPZShapeH1<pzshape::TPZShapeTetra>::Initialize
            (&(data->fCornerNodeIds).super_TPZVec<long>,&scalarOrders.super_TPZVec<int>,data);
  if (connectorders->fNElements != 5) {
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/TPZShapeHDiv.cpp"
               ,0x26);
  }
  TPZManVector<int,_27>::TPZManVector(&local_c0,connectorders);
  TPZManVector<int,_27>::operator=(&data->fHDivConnectOrders,&local_c0);
  TPZManVector<int,_27>::~TPZManVector(&local_c0);
  TPZManVector<int,_27>::Resize(&data->fHDivNumConnectShape,5);
  iVar2 = 0;
  for (lVar6 = 0; lVar6 != 5; lVar6 = lVar6 + 1) {
    iVar1 = ComputeNConnectShapeF
                      ((int)lVar6,(data->fHDivConnectOrders).super_TPZVec<int>.fStore[lVar6]);
    (data->fHDivNumConnectShape).super_TPZVec<int>.fStore[lVar6] = iVar1;
    iVar2 = iVar2 + iVar1;
  }
  TPZManVector<std::pair<int,_long>,_60>::Resize(&data->fSDVecShapeIndex,(long)iVar2);
  ComputeMasterDirections(data);
  ComputeVecandShape(data);
  iVar2 = (int)(data->fHDivConnectOrders).super_TPZVec<int>.fNElements;
  uVar3 = iVar2 - 1;
  uVar5 = 0;
  uVar4 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    uVar4 = uVar5;
  }
  while( true ) {
    if (uVar4 == uVar5) {
      TPZManVector<int,_27>::~TPZManVector(&scalarOrders);
      return;
    }
    if ((data->fHDivConnectOrders).super_TPZVec<int>.fStore[(long)iVar2 + -1] <
        (data->fHDivConnectOrders).super_TPZVec<int>.fStore[uVar5]) break;
    uVar5 = uVar5 + 1;
  }
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Shape/TPZShapeHDiv.cpp"
             ,0x3e);
}

Assistant:

void TPZShapeHDiv<TSHAPE>::Initialize(const TPZVec<int64_t> &ids,
                                      const TPZVec<int> &connectorders,
                                      const TPZVec<int>& sideorient,
                                      TPZShapeData &data)
{
    
        
    data.fCornerNodeIds = ids;
    data.fSideOrient = sideorient;
    const int ncon = TSHAPE::NFacets+1;
    //data.fHDivConnectOrders = connectorders;TODOPHIL
    int scalarorder = connectorders[TSHAPE::NFacets]+1;
    TPZManVector<int,27> scalarOrders(TSHAPE::NSides-TSHAPE::NCornerNodes,scalarorder);
    

    TPZShapeH1<TSHAPE>::Initialize(data.fCornerNodeIds, scalarOrders, data);
    if(connectorders.size() != TSHAPE::NFacets+1) DebugStop();
    
    data.fHDivConnectOrders = connectorders;

    data.fHDivNumConnectShape.Resize(TSHAPE::NFacets+1);
    int nShape = 0;
    for (int i = 0; i < TSHAPE::NFacets+1; i++)
    {
        int order = data.fHDivConnectOrders[i];
        data.fHDivNumConnectShape[i] = ComputeNConnectShapeF(i,order);
        nShape += data.fHDivNumConnectShape[i];
    }
    
    data.fSDVecShapeIndex.Resize(nShape);

    ComputeMasterDirections(data);
    ComputeVecandShape(data);
    
    //Checks if the last connect order is >= then the other connects
    int size = data.fHDivConnectOrders.size();
    int maxOrder = data.fHDivConnectOrders[size-1];
    for (int i = 0; i < size-1; i++)
    {
        if (data.fHDivConnectOrders[i] > maxOrder){
            DebugStop();
        }
    }    
}